

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O1

void __thiscall
persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
compute_zeroth_persistence
          (persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
           *this,unsigned_short min_dimension,unsigned_short param_2)

{
  iterator *piVar1;
  ushort uVar2;
  unsigned_long uVar3;
  directed_flag_complex_computer_t *pdVar4;
  filtered_directed_graph_t *pfVar5;
  pointer puVar6;
  pair<float,_int> *ppVar7;
  uint uVar8;
  pointer pfVar9;
  pointer pfVar10;
  ostream *poVar11;
  long *plVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  char *__to;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  pair<float,_int> pVar22;
  ulong uVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  vector<filtration_index_t,_std::allocator<filtration_index_t>_> edges;
  filtration_index_t e;
  filtered_union_find dset;
  vector<filtration_index_t,_std::allocator<filtration_index_t>_> local_108;
  vector<float,_std::allocator<float>_> local_e8;
  _Map_pointer ppfStack_d0;
  unsigned_long local_c0;
  deque<filtration_index_t,std::allocator<filtration_index_t>> *local_b8;
  filtered_union_find local_b0;
  pair<float,_int> local_68;
  pair<float,_int> local_60;
  pair<float,_int> local_58;
  _Elt_pointer pfStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  directed_flag_complex_computer::directed_flag_complex_computer_t::prepare_next_dimension
            (this->complex,0);
  if (min_dimension < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"computing persistent homology in dimension 0",0x2c);
    poVar11 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\r",1);
    uVar3 = *(this->complex->cell_count).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<float,_std::allocator<float>_>::vector
              (&local_e8,&this->complex->graph->vertex_filtration);
    filtered_union_find::filtered_union_find(&local_b0,&local_e8);
    local_c0 = uVar3;
    if ((pair<float,_int>)
        local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pair<float,_int>)0x0) {
      operator_delete(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (filtration_index_t *)0x0;
    uVar20 = (uint)(this->complex->cell_count).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[1];
    if (0 < (int)uVar20) {
      lVar21 = 0;
      uVar23 = 0;
      do {
        if (this->complex->filtration_algorithm == (filtration_algorithm_t *)0x0) {
          fVar26 = 0.0;
        }
        else {
          fVar26 = (this->complex->graph->edge_filtration).
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start[uVar23];
        }
        if (fVar26 <= this->max_filtration) {
          local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)((ulong)(uint)fVar26 + lVar21);
          if (local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<filtration_index_t,_std::allocator<filtration_index_t>_>::
            _M_realloc_insert<filtration_index_t>
                      (&local_108,
                       (iterator)
                       local_108.
                       super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(filtration_index_t *)&local_e8);
          }
          else {
            *local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
             _M_impl.super__Vector_impl_data._M_finish =
                 (filtration_index_t)
                 local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((long)local_108.
                                 super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 8);
          }
        }
        uVar23 = uVar23 + 1;
        lVar21 = lVar21 + 0x100000000;
      } while ((uVar20 & 0x7fffffff) != uVar23);
    }
    pfVar10 = local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pfVar9 = local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_108.
                          super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
      local_58 = (pair<float,_int>)
                 local_108.
                 super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl
                 .super__Vector_impl_data._M_start;
      uVar23 = (long)local_108.
                     super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_108.
                     super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      lVar21 = 0x3f;
      if (uVar23 != 0) {
        for (; uVar23 >> lVar21 == 0; lVar21 = lVar21 + -1) {
        }
      }
      std::
      __introsort_loop<std::reverse_iterator<__gnu_cxx::__normal_iterator<filtration_index_t*,std::vector<filtration_index_t,std::allocator<filtration_index_t>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<greater_filtration_or_smaller_index<filtration_index_t>>>
                (&local_e8,&local_58,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
      local_60 = (pair<float,_int>)pfVar10;
      local_68 = (pair<float,_int>)pfVar9;
      std::
      __final_insertion_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<filtration_index_t*,std::vector<filtration_index_t,std::allocator<filtration_index_t>>>>,__gnu_cxx::__ops::_Iter_comp_iter<greater_filtration_or_smaller_index<filtration_index_t>>>
                ();
    }
    (*this->output->_vptr_output_t[5])(this->output,0);
    pfVar9 = local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_b8 = (deque<filtration_index_t,std::allocator<filtration_index_t>> *)
                 &this->columns_to_reduce;
      pVar22 = (pair<float,_int>)
               local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = *(pointer *)pVar22;
        pdVar4 = this->complex;
        pfVar5 = pdVar4->graph;
        uVar19 = (ulong)(int)((ulong)local_e8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 0x1f);
        puVar6 = (pfVar5->super_directed_graph_t).edges.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar2 = puVar6[uVar19 & 0x7ffffffffffffffe];
        uVar23 = (ulong)uVar2;
        uVar20 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar23];
        uVar15 = uVar20;
        uVar14 = uVar20;
        if (uVar20 != uVar2) {
          do {
            uVar14 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar15];
            bVar24 = uVar14 != uVar15;
            uVar15 = uVar14;
          } while (bVar24);
        }
        uVar2 = *(ushort *)((long)puVar6 + (uVar19 * 2 | 2));
        uVar19 = (ulong)uVar2;
        for (; uVar14 != uVar20;
            uVar20 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar20]) {
          local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar23] = uVar14;
          uVar23 = (ulong)uVar20;
        }
        uVar20 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar19];
        __to = (char *)(ulong)uVar20;
        if (uVar20 != uVar2) {
          do {
            uVar15 = (uint)__to;
            __to = (char *)(ulong)(uint)local_b0.parent.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start[(int)uVar15];
          } while (local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar15] != uVar15);
        }
        for (; uVar15 = (uint)__to, uVar15 != uVar20;
            uVar20 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar20]) {
          local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar19] = uVar15;
          uVar19 = (ulong)uVar20;
        }
        if (uVar14 == uVar15) {
          ppVar7 = &((this->columns_to_reduce).
                     super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_cur)->super_pair<float,_int>;
          if (ppVar7 == &(this->columns_to_reduce).
                         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                         _M_impl.super__Deque_impl_data._M_finish._M_last[-1].super_pair<float,_int>
             ) {
            std::deque<filtration_index_t,std::allocator<filtration_index_t>>::
            _M_push_back_aux<filtration_index_t_const&>(local_b8,(filtration_index_t *)&local_e8);
          }
          else {
            *ppVar7 = (pair<float,_int>)
                      local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar1 = &(this->columns_to_reduce).
                      super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                      _M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
        }
        else {
          fVar25 = 0.0;
          fVar26 = 0.0;
          if (pdVar4->filtration_algorithm != (filtration_algorithm_t *)0x0) {
            fVar26 = (pfVar5->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start[(int)uVar14];
            fVar25 = (pfVar5->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start[(int)uVar15];
          }
          filtered_union_find::link(&local_b0,(char *)(ulong)uVar14,__to);
          if (min_dimension == 0) {
            fVar27 = fVar25;
            if (fVar25 <= fVar26) {
              fVar27 = fVar26;
            }
            if (fVar27 < local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) {
              uVar20 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar14];
              uVar13 = uVar20;
              uVar8 = uVar14;
              uVar15 = uVar20;
              if (uVar20 != uVar14) {
                do {
                  uVar15 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(int)uVar13];
                  bVar24 = uVar15 != uVar13;
                  uVar13 = uVar15;
                } while (bVar24);
              }
              while (uVar13 = uVar20, uVar15 != uVar13) {
                local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(int)uVar8] = uVar15;
                uVar8 = uVar13;
                uVar20 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)uVar13];
              }
              if (uVar15 != uVar14) {
                fVar25 = fVar26;
              }
              (*this->output->_vptr_output_t[6])(fVar25);
            }
          }
        }
        pVar22 = (pair<float,_int>)((long)pVar22 + 8);
      } while (pVar22 != (pair<float,_int>)pfVar9);
    }
    local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(this->columns_to_reduce).
                        super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
    local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(this->columns_to_reduce).
                         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                         _M_impl.super__Deque_impl_data._M_start._M_first;
    local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)(this->columns_to_reduce).
                  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl
                  .super__Deque_impl_data._M_start._M_last;
    ppfStack_d0 = (this->columns_to_reduce).
                  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl
                  .super__Deque_impl_data._M_start._M_node;
    local_58 = (pair<float,_int>)
               (this->columns_to_reduce).
               super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    pfStack_50 = (this->columns_to_reduce).
                 super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_first;
    local_48 = *(undefined4 *)
                &(this->columns_to_reduce).
                 super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_last;
    uStack_44 = *(undefined4 *)
                 ((long)&(this->columns_to_reduce).
                         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                         _M_impl.super__Deque_impl_data._M_finish._M_last + 4);
    uStack_40 = *(undefined4 *)
                 &(this->columns_to_reduce).
                  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl
                  .super__Deque_impl_data._M_finish._M_node;
    uStack_3c = *(undefined4 *)
                 ((long)&(this->columns_to_reduce).
                         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                         _M_impl.super__Deque_impl_data._M_finish._M_node + 4);
    std::__reverse<std::_Deque_iterator<filtration_index_t,filtration_index_t&,filtration_index_t*>>
              ();
    if (min_dimension != 1) {
      uVar20 = (uint)local_c0;
      if ((int)uVar20 < 1) {
        lVar21 = 0;
      }
      else {
        uVar23 = 0;
        lVar21 = 0;
        do {
          uVar16 = (ulong)(uint)local_b0.parent.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar23];
          uVar19 = uVar16;
          if (uVar23 != uVar16) {
            do {
              uVar14 = (uint)uVar19;
              uVar19 = (ulong)(uint)local_b0.parent.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[(int)uVar14];
            } while (local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar14] != uVar14);
          }
          uVar14 = (uint)uVar19;
          if (uVar14 != local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar23]) {
            uVar18 = uVar23 & 0xffffffff;
            do {
              uVar17 = uVar16;
              local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar18] = uVar14;
              uVar16 = (ulong)(uint)local_b0.parent.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[(int)uVar17];
              uVar18 = uVar17;
            } while (uVar14 != local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start[(int)uVar17]);
          }
          if (uVar23 == uVar19) {
            if (this->complex->filtration_algorithm == (filtration_algorithm_t *)0x0) {
              fVar26 = 0.0;
            }
            else {
              fVar26 = (this->complex->graph->vertex_filtration).
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar23];
            }
            (*this->output->_vptr_output_t[7])(fVar26);
            lVar21 = lVar21 + 1;
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != (uVar20 & 0x7fffffff));
      }
      (*this->output->_vptr_output_t[9])(this->output,lVar21,0);
      if (this->print_betti_numbers_to_console == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"The dimensions of the mod-",0x1a);
        poVar11 = (ostream *)std::ostream::operator<<(&std::cout,this->modulus);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11," homology of the full complex are:",0x22);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        plVar12 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
        std::ostream::put((char)plVar12);
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"dim H_0 = ",10);
        poVar11 = std::ostream::_M_insert<long_long>((longlong)poVar11);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
      }
      this->euler_characteristic = this->euler_characteristic + (int)lVar21;
    }
    if ((pair<float,_int>)
        local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
        _M_impl.super__Vector_impl_data._M_start != (pair<float,_int>)0x0) {
      operator_delete(local_108.
                      super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.
                            super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.
                            super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b0.filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.filtration.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.filtration.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b0.rank.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.rank.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.rank.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.rank.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void compute_zeroth_persistence(unsigned short min_dimension, unsigned short) {
		complex.prepare_next_dimension(0);

		// Only compute this if we actually need it
		if (min_dimension > 1) return;

#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "computing persistent homology in dimension 0" << std::flush << "\r";
#endif

		long long betti_number = 0;
#ifdef RETRIEVE_PERSISTENCE
		std::vector<std::pair<value_t, value_t>> birth_death;
#endif
		size_t n = complex.number_of_cells(0);
		filtered_union_find dset(complex.vertex_filtration());
		std::vector<filtration_index_t> edges;
		index_t number_of_edges = index_t(complex.number_of_cells(1));
		for (index_t index = 0; index < number_of_edges; index++) {
			value_t filtration = complex.filtration(1, index);
			if (filtration <= max_filtration) edges.push_back(std::make_pair(filtration, index));
		}
		std_algorithms::sort(edges.rbegin(), edges.rend(), greater_filtration_or_smaller_index<filtration_index_t>());

		// Let the output class know that we are now computing zeroth degree barcodes
		output->computing_barcodes_in_dimension(0);

		for (auto e : edges) {
			const auto vertices = complex.vertices_of_edge(get_index(e));
			index_t u = dset.find(vertices.first), v = dset.find(vertices.second);

			if (u != v) {
				// Only output bars if we are interested in zeroth homology
				const auto filtration_u = complex.filtration(0, u);
				const auto filtration_v = complex.filtration(0, v);
				dset.link(u, v);
				if (min_dimension == 0 && get_filtration(e) > std::max(filtration_u, filtration_v)) {
					// Check which vertex is merged into which other vertex.
					const auto f = dset.find(u) == u ? filtration_v : filtration_u;
					output->new_barcode(f, get_filtration(e));
#ifdef RETRIEVE_PERSISTENCE
					birth_death.push_back(std::make_pair(f, get_filtration(e)));
#endif
				}
			} else {
				columns_to_reduce.push_back(e);
			}
		}
		std::reverse(columns_to_reduce.begin(), columns_to_reduce.end());

		// If we don't care about zeroth homology, then we can stop here
		if (min_dimension == 1) return;

		for (index_t index = 0; index < index_t(n); ++index) {
			if (dset.find(index) == index) {
				output->new_infinite_barcode(complex.filtration(0, index));
				betti_number++;
#ifdef RETRIEVE_PERSISTENCE
				birth_death.push_back(
				    std::make_pair(complex.filtration(0, index), std::numeric_limits<value_t>::infinity()));
#endif
			}
		}

#ifdef RETRIEVE_PERSISTENCE
		betti_numbers.push_back(betti_number);
		birth_deaths_by_dim.push_back(birth_death);
#endif
		// Report the betti number back to the complex and the output
		complex.computation_result(0, betti_number, 0);
		output->betti_number(betti_number, 0);

		if (print_betti_numbers_to_console) {
			std::cout << "\033[K"
			          << "The dimensions of the mod-" << modulus << " homology of the full complex are:" << std::endl
			          << std::endl
			          << "dim H_0 = " << betti_number << std::endl;
		}
		euler_characteristic += index_t(betti_number);
	}